

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

void Dump(OutputStream *stream,SQFuncState *fState)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQObjectValue SVar5;
  ulong uVar6;
  char *pcVar7;
  SQInt32 _nliterals;
  SQObject *pSVar8;
  SQObjectPtr refidx;
  SQObjectPtrVec literals;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObject local_88;
  sqvector<SQObjectPtr,_unsigned_int> local_70;
  SQObject local_58;
  SQObjectPtr local_48;
  
  if ((fState->_name).super_SQObject._type == OT_STRING) {
    pcVar7 = (char *)&((fState->_name).super_SQObject._unVal.pTable)->_firstfree;
  }
  else {
    pcVar7 = "unknown";
  }
  streamprintf(stream,"*****FUNCTION [%s]\n",pcVar7);
  local_70._alloc_ctx = fState->_sharedstate->_alloc_ctx;
  local_70._vals = (SQObjectPtr *)0x0;
  local_70._size = 0;
  local_70._allocated = 0;
  local_88._unVal.pTable = (SQTable *)0x0;
  local_88._type = OT_NULL;
  local_88._flags = '\0';
  local_88._5_3_ = 0;
  sqvector<SQObjectPtr,_unsigned_int>::resize
            (&local_70,((fState->_literals).super_SQObject._unVal.pTable)->_usednodes,
             (SQObjectPtr *)&local_88);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_88);
  local_88._unVal.pTable = (SQTable *)0x0;
  local_88._type = OT_NULL;
  local_88._flags = '\0';
  local_88._5_3_ = 0;
  local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_48.super_SQObject._type = OT_NULL;
  local_48.super_SQObject._flags = '\0';
  local_48.super_SQObject._5_3_ = 0;
  local_58._unVal.pTable = (SQTable *)0x0;
  local_58._type = OT_NULL;
  local_58._flags = '\0';
  local_58._5_3_ = 0;
  while( true ) {
    pSVar8 = &local_58;
    SVar5.nInteger =
         SQTable::Next((fState->_literals).super_SQObject._unVal.pTable,false,
                       (SQObjectPtr *)&local_88,&local_48,(SQObjectPtr *)&local_58);
    _nliterals = (SQInt32)pSVar8;
    if (SVar5.pTable == (SQTable *)0xffffffffffffffff) break;
    uVar6 = local_58._unVal.nInteger & 0xffffffff;
    SVar3 = local_70._vals[uVar6].super_SQObject._type;
    pSVar4 = local_70._vals[uVar6].super_SQObject._unVal.pTable;
    pSVar2 = local_70._vals + uVar6;
    (pSVar2->super_SQObject)._type = local_48.super_SQObject._type;
    (pSVar2->super_SQObject)._flags = local_48.super_SQObject._flags;
    *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = local_48.super_SQObject._5_3_;
    (pSVar2->super_SQObject)._unVal.fFloat = local_48.super_SQObject._unVal.fFloat;
    *(undefined4 *)((long)&(pSVar2->super_SQObject)._unVal + 4) =
         local_48.super_SQObject._unVal.nInteger._4_4_;
    if ((local_70._vals[uVar6].super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((local_70._vals[uVar6].super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    if ((local_88._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((local_88._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                ._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((local_88._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
          _vptr_SQRefCounted[2])();
      }
    }
    local_88._0_5_ = 0x5000002;
    local_88._unVal.nInteger = SVar5.nInteger;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_88);
  DumpLiterals(stream,local_70._vals,local_70._size);
  DumpLocals(stream,(fState->_localvarinfos)._vals,(fState->_localvarinfos)._size);
  DumpLineInfo(stream,(fState->_lineinfos)._vals,(fState->_lineinfos)._size);
  streamprintf(stream,"-----dump\n");
  DumpInstructions(stream,(fState->_instructions)._vals,(fState->_instructions)._size,local_70._vals
                   ,_nliterals);
  sqvector<SQObjectPtr,_unsigned_int>::_releasedata(&local_70);
  return;
}

Assistant:

void Dump(OutputStream *stream, const SQFuncState *fState)
{
    streamprintf(stream, _SC("*****FUNCTION [%s]\n"), sq_type(fState->_name) == OT_STRING ? _stringval(fState->_name) : _SC("unknown"));
    SQObjectPtrVec literals(fState->_sharedstate->_alloc_ctx);
    literals.resize(_table(fState->_literals)->CountUsed());
    {
        SQObjectPtr refidx,key,val;
        SQInteger idx;
        while((idx=_table(fState->_literals)->Next(false,refidx,key,val))!=-1) {
            literals[_integer(val)]=key;
            refidx=idx;
        }
    }
    DumpLiterals(stream, literals.begin(), literals.size());
    DumpLocals(stream, fState->_localvarinfos.begin(), fState->_localvarinfos.size());
    DumpLineInfo(stream, fState->_lineinfos.begin(), fState->_lineinfos.size());
    streamprintf(stream, _SC("-----dump\n"));
    DumpInstructions(stream, fState->_instructions.begin(), fState->_instructions.size(), literals.begin(), literals.size());
}